

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

void __thiscall Table::push_new_value_in_column(Table *this,int cnt,string *value)

{
  types tVar1;
  int iVar2;
  char *pcVar3;
  iterator __position;
  pointer ppVar4;
  iterator __position_00;
  int *piVar5;
  long lVar6;
  pointer ptVar7;
  undefined8 uVar8;
  pointer ppVar9;
  ulong uVar10;
  char *pcVar11;
  undefined1 auVar12 [16];
  int local_44;
  char *local_40;
  pointer local_38;
  
  ptVar7 = (this->columns).
           super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start + cnt;
  tVar1 = (ptVar7->
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
          ).super__Tuple_impl<1UL,_Table::types,_int>.super__Head_base<1UL,_Table::types,_false>.
          _M_head_impl;
  if (tVar1 == STRING) {
LAB_001038c2:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->string_cols).
                 super__Vector_base<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [*(int *)&(ptVar7->
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
                           ).super__Tuple_impl<1UL,_Table::types,_int>.super__Tuple_impl<2UL,_int>].
                 second,value);
    ppVar4 = (this->string_cols).
             super__Vector_base<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar2 = *(int *)&(this->columns).
                     super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[cnt].
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
                     .super__Tuple_impl<1UL,_Table::types,_int>.super__Tuple_impl<2UL,_int>;
    uVar10 = (long)*(pointer *)
                    ((long)&ppVar4[iVar2].second.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl + 8) -
             *(long *)&ppVar4[iVar2].second.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl >> 5;
    goto LAB_0010396f;
  }
  if (tVar1 == FLOAT) {
    iVar2 = *(int *)&(ptVar7->
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
                     ).super__Tuple_impl<1UL,_Table::types,_int>.super__Tuple_impl<2UL,_int>;
    local_38 = (this->float_cols).
               super__Vector_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pcVar3 = (value->_M_dataplus)._M_p;
    piVar5 = __errno_location();
    local_44 = *piVar5;
    *piVar5 = 0;
    pcVar11 = (char *)strtod(pcVar3,&local_40);
    if (local_40 == pcVar3) {
      std::__throw_invalid_argument("stod");
      goto LAB_001039b8;
    }
    if (*piVar5 == 0) {
      *piVar5 = local_44;
    }
    else if (*piVar5 == 0x22) {
      auVar12 = std::__throw_out_of_range("stod");
      value = auVar12._8_8_;
      ptVar7 = auVar12._0_8_;
      goto LAB_001038c2;
    }
    __position_00._M_current =
         *(pointer *)
          ((long)&local_38[iVar2].second.super__Vector_base<double,_std::allocator<double>_>._M_impl
          + 8);
    if (__position_00._M_current ==
        *(pointer *)
         ((long)&local_38[iVar2].second.super__Vector_base<double,_std::allocator<double>_>._M_impl
         + 0x10)) {
      local_40 = pcVar11;
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_38[iVar2].second,__position_00,(double *)&local_40);
    }
    else {
      *__position_00._M_current = (double)pcVar11;
      *(double **)
       ((long)&local_38[iVar2].second.super__Vector_base<double,_std::allocator<double>_>._M_impl +
       8) = __position_00._M_current + 1;
    }
    ptVar7 = (this->columns).
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar9 = (this->float_cols).
             super__Vector_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    if (tVar1 != INT) {
      std::operator<<((ostream *)&std::cerr,"push_new_value_in_column\n");
      exit(1);
    }
    iVar2 = *(int *)&(ptVar7->
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
                     ).super__Tuple_impl<1UL,_Table::types,_int>.super__Tuple_impl<2UL,_int>;
    local_38 = (pointer)(this->int_cols).
                        super__Vector_base<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
    pcVar3 = (value->_M_dataplus)._M_p;
    piVar5 = __errno_location();
    local_44 = *piVar5;
    *piVar5 = 0;
    lVar6 = strtol(pcVar3,&local_40,10);
    if (local_40 == pcVar3) {
LAB_001039b8:
      std::__throw_invalid_argument("stoi");
LAB_001039c4:
      uVar8 = std::__throw_out_of_range("stoi");
      if (*piVar5 == 0) {
        *piVar5 = local_44;
      }
      _Unwind_Resume(uVar8);
    }
    if (((int)lVar6 != lVar6) || (*piVar5 == 0x22)) goto LAB_001039c4;
    if (*piVar5 == 0) {
      *piVar5 = local_44;
    }
    local_40 = (char *)(long)(int)lVar6;
    __position._M_current =
         *(longlong **)
          ((long)&local_38[iVar2].second.super__Vector_base<double,_std::allocator<double>_>._M_impl
          + 8);
    if ((pointer)__position._M_current ==
        *(pointer *)
         ((long)&local_38[iVar2].second.super__Vector_base<double,_std::allocator<double>_>._M_impl
         + 0x10)) {
      std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                ((vector<long_long,_std::allocator<long_long>_> *)&local_38[iVar2].second,__position
                 ,(longlong *)&local_40);
    }
    else {
      *__position._M_current = (longlong)local_40;
      *(longlong **)
       ((long)&local_38[iVar2].second.super__Vector_base<double,_std::allocator<double>_>._M_impl +
       8) = __position._M_current + 1;
    }
    ptVar7 = (this->columns).
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar9 = (pointer)(this->int_cols).
                      super__Vector_base<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
  }
  iVar2 = *(int *)&ptVar7[cnt].
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
                   .super__Tuple_impl<1UL,_Table::types,_int>.super__Tuple_impl<2UL,_int>;
  uVar10 = (long)*(pointer *)
                  ((long)&ppVar9[iVar2].second.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl + 8) -
           *(long *)&ppVar9[iVar2].second.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl >> 3;
LAB_0010396f:
  if ((ulong)(long)this->rows < uVar10) {
    this->rows = this->rows + 1;
  }
  return;
}

Assistant:

void push_new_value_in_column(int cnt, std::string value) {
        switch (std::get<1>(columns[cnt])) {
            case INT:
                int_cols[std::get<2>(columns[cnt])].second.push_back(std::stoi(value));
                if (int_cols[std::get<2>(columns[cnt])].second.size() > rows) rows++;
                break;
            case FLOAT:
                float_cols[std::get<2>(columns[cnt])].second.push_back(std::stod(value));
                if (float_cols[std::get<2>(columns[cnt])].second.size() > rows) rows++;
                break;
            case STRING:
                string_cols[std::get<2>(columns[cnt])].second.push_back(value);
                if (string_cols[std::get<2>(columns[cnt])].second.size() > rows) rows++;
                break;
            default:
                std::cerr << "push_new_value_in_column\n";
                exit(EXIT_FAILURE);
        }
    }